

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O0

void __thiscall OutputBox::OutputBox(OutputBox *this,string *title,uint bar_width,uint pre_spaces)

{
  bool bVar1;
  ulong uVar2;
  uint local_8c;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  uint local_20;
  uint local_1c;
  uint pre_spaces_local;
  uint bar_width_local;
  string *title_local;
  OutputBox *this_local;
  
  local_20 = pre_spaces;
  local_1c = bar_width;
  _pre_spaces_local = title;
  title_local = (string *)this;
  std::__cxx11::string::string((string *)&this->title_);
  ProgressBar::ProgressBar(&this->pb);
  this->pre_spaces_ = local_20;
  if (local_1c < 0x51) {
    local_8c = local_1c;
  }
  else {
    local_8c = 0x50;
  }
  this->bar_width_ = local_8c;
  this->bar_width_ = this->bar_width_ - this->pre_spaces_;
  uVar2 = std::__cxx11::string::size();
  if (this->bar_width_ - 4 < uVar2) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)_pre_spaces_local);
    std::operator+(local_50,(char *)local_70);
    std::__cxx11::string::operator=((string *)&this->title_,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string(local_70);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->title_,(string *)_pre_spaces_local);
  }
  bVar1 = std::operator!=(&this->title_,"");
  if (bVar1) {
    StreamDemultiplexer::operator<<((StreamDemultiplexer *)dmux::cout,(char (*) [2])0x40f0c8);
    PrintSeparatorLine(this);
    PrintData(this,&this->title_);
    PrintSeparatorLine(this);
  }
  return;
}

Assistant:

OutputBox(const std::string& title = "", 
        const unsigned bar_width = CONSOLE_WIDTH, 
        const unsigned pre_spaces = 2)
    {
        pre_spaces_ = pre_spaces;
        bar_width_ = bar_width > CONSOLE_WIDTH ? CONSOLE_WIDTH : bar_width;
        bar_width_ -= pre_spaces_;

        if (title.size() > bar_width_ - 4) {
            title_ = title.substr(0, bar_width_ - 4 - 3) + "...";
        }
        else {
            title_ = title;
        }
        //transform(title_.begin(), title_.end(), title_.begin(), ::toupper);

        if (title_ != "") {
            dmux::cout << "\n";
            PrintSeparatorLine();
            PrintData(title_);
            PrintSeparatorLine();
        }
    }